

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintSumOperation>
               (hugeint_t *idata,AggregateInputData *aggr_input_data,
               SumState<duckdb::hugeint_t> **states,ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  SumState<duckdb::hugeint_t> *pSVar3;
  hugeint_t lhs;
  hugeint_t lhs_00;
  hugeint_t rhs;
  hugeint_t rhs_00;
  hugeint_t rhs_01;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  SumState<duckdb::hugeint_t> **ppSVar10;
  SumState<duckdb::hugeint_t> **ppSVar11;
  hugeint_t hVar12;
  uint64_t in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa0;
  int64_t *piVar13;
  uint64_t in_stack_ffffffffffffffa8;
  ulong uVar14;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar6 = 0;
      do {
        pSVar3 = states[iVar6];
        pSVar3->isset = true;
        hVar12.upper = in_stack_ffffffffffffffa0;
        hVar12.lower = in_stack_ffffffffffffff98;
        rhs_01.upper = (int64_t)states;
        rhs_01.lower = in_stack_ffffffffffffffa8;
        hVar12 = Hugeint::Add<true>(hVar12,rhs_01);
        pSVar3->value = hVar12;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar14 = count + 0x3f >> 6;
    piVar13 = &idata->upper;
    uVar5 = 0;
    uVar8 = 0;
    ppSVar10 = states;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      ppSVar11 = ppSVar10;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
LAB_004200e6:
        uVar4 = uVar8;
        if (uVar8 < uVar9) {
          do {
            pSVar3 = ppSVar10[uVar8];
            pSVar3->isset = true;
            lhs_00.upper = (int64_t)piVar13;
            lhs_00.lower = uVar5;
            rhs_00.upper = (int64_t)states;
            rhs_00.lower = uVar14;
            hVar12 = Hugeint::Add<true>(lhs_00,rhs_00);
            pSVar3->value = hVar12;
            uVar8 = uVar8 + 1;
            uVar4 = uVar9;
          } while (uVar9 != uVar8);
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_004200e6;
        uVar4 = uVar9;
        if ((uVar2 != 0) && (uVar4 = uVar8, uVar8 < uVar9)) {
          uVar7 = 0;
          do {
            if ((uVar2 >> (uVar7 & 0x3f) & 1) != 0) {
              pSVar3 = ppSVar10[uVar8 + uVar7];
              pSVar3->isset = true;
              lhs.upper = (int64_t)piVar13;
              lhs.lower = uVar5;
              rhs.upper = (int64_t)states;
              rhs.lower = uVar14;
              ppSVar11 = states;
              hVar12 = Hugeint::Add<true>(lhs,rhs);
              pSVar3->value = hVar12;
              states = ppSVar11;
            }
            uVar7 = uVar7 + 1;
            uVar4 = uVar9;
          } while (uVar9 - uVar8 != uVar7);
        }
      }
      uVar8 = uVar4;
      uVar5 = uVar5 + 1;
      ppSVar10 = ppSVar11;
    } while (uVar5 != uVar14);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}